

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  byte bVar1;
  stbi__context *psVar2;
  stbi_uc sVar3;
  sbyte sVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  byte *pbVar9;
  stbi_uc *psVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  long in_FS_OFFSET;
  bool bVar17;
  int sizes [16];
  uint local_78 [18];
  int iVar8;
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar7 = stbi__get16be(z->s);
      iVar15 = uVar7 - 2;
      if (2 < uVar7) {
        do {
          psVar2 = z->s;
          pbVar9 = psVar2->img_buffer;
          if (pbVar9 < psVar2->img_buffer_end) {
LAB_001614b3:
            psVar2->img_buffer = pbVar9 + 1;
            bVar5 = *pbVar9;
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar2);
              pbVar9 = psVar2->img_buffer;
              goto LAB_001614b3;
            }
            bVar5 = 0;
          }
          if ((0x1f < bVar5) || (bVar14 = bVar5 & 0xf, 3 < bVar14)) goto LAB_001616e8;
          lVar16 = 0;
          uVar7 = 0;
          do {
            psVar2 = z->s;
            pbVar9 = psVar2->img_buffer;
            if (pbVar9 < psVar2->img_buffer_end) {
LAB_00161510:
              psVar2->img_buffer = pbVar9 + 1;
              uVar12 = (uint)*pbVar9;
            }
            else {
              if (psVar2->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar2);
                pbVar9 = psVar2->img_buffer;
                goto LAB_00161510;
              }
              uVar12 = 0;
            }
            local_78[lVar16] = uVar12;
            uVar7 = uVar7 + uVar12;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          if (bVar5 < 0x10) {
            iVar8 = stbi__build_huffman(z->huff_dc + bVar14,(int *)local_78);
            lVar16 = 8;
          }
          else {
            iVar8 = stbi__build_huffman(z->huff_ac + bVar14,(int *)local_78);
            lVar16 = 0x1a48;
          }
          if (iVar8 == 0) goto LAB_001616f8;
          if (uVar7 != 0) {
            uVar11 = 0;
            do {
              psVar2 = z->s;
              psVar10 = psVar2->img_buffer;
              if (psVar10 < psVar2->img_buffer_end) {
LAB_001615c9:
                psVar2->img_buffer = psVar10 + 1;
                sVar3 = *psVar10;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar10 = psVar2->img_buffer;
                  goto LAB_001615c9;
                }
                sVar3 = '\0';
              }
              z->huff_dc[bVar14].values[uVar11 + lVar16 + -8] = sVar3;
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
          }
          if (0xf < bVar5) {
            lVar16 = 0;
            do {
              uVar11 = (ulong)z->huff_ac[bVar14].fast[lVar16];
              z->fast_ac[bVar14][lVar16] = 0;
              if (uVar11 != 0xff) {
                bVar5 = z->huff_ac[bVar14].values[uVar11];
                if ((bVar5 & 0xf) != 0) {
                  bVar1 = z->huff_ac[bVar14].size[uVar11];
                  uVar6 = (bVar5 & 0xf) + (ushort)bVar1;
                  if (uVar6 < 10) {
                    uVar13 = (int)lVar16 << (bVar1 & 0x1f) & 0x1ff;
                    sVar4 = (sbyte)(bVar5 & 0xf);
                    uVar12 = -1 << sVar4 | 1;
                    if (0xff < uVar13) {
                      uVar12 = 0;
                    }
                    iVar8 = uVar12 + (uVar13 >> (9U - sVar4 & 0x1f));
                    if ((char)iVar8 == iVar8) {
                      z->fast_ac[bVar14][lVar16] = (short)iVar8 * 0x100 | bVar5 & 0xfff0 | uVar6;
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x200);
          }
          iVar15 = (iVar15 + -0x11) - uVar7;
        } while (0 < iVar15);
      }
    }
    else {
      if (m != 0xdb) {
LAB_0016139f:
        if ((m == 0xfe || (m & 0xfffffff0U) == 0xe0) && (uVar7 = stbi__get16be(z->s), 1 < uVar7)) {
          if (uVar7 < 7 || m != 0xe0) {
            if (uVar7 < 0xe || m != 0xee) {
              iVar15 = uVar7 - 2;
            }
            else {
              bVar17 = true;
              lVar16 = 0;
              do {
                psVar2 = z->s;
                psVar10 = psVar2->img_buffer;
                if (psVar10 < psVar2->img_buffer_end) {
LAB_00161761:
                  psVar2->img_buffer = psVar10 + 1;
                  sVar3 = *psVar10;
                }
                else {
                  if (psVar2->read_from_callbacks != 0) {
                    stbi__refill_buffer(psVar2);
                    psVar10 = psVar2->img_buffer;
                    goto LAB_00161761;
                  }
                  sVar3 = '\0';
                }
                if (sVar3 != "Adobe"[lVar16]) {
                  bVar17 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 != 6);
              if (bVar17) {
                stbi__get8(z->s);
                stbi__get16be(z->s);
                stbi__get16be(z->s);
                bVar5 = stbi__get8(z->s);
                z->app14_color_transform = (uint)bVar5;
                iVar15 = uVar7 - 0xe;
              }
              else {
                iVar15 = uVar7 - 8;
              }
            }
          }
          else {
            bVar17 = true;
            lVar16 = 0;
            do {
              psVar2 = z->s;
              psVar10 = psVar2->img_buffer;
              if (psVar10 < psVar2->img_buffer_end) {
LAB_00161428:
                psVar2->img_buffer = psVar10 + 1;
                sVar3 = *psVar10;
              }
              else {
                if (psVar2->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar2);
                  psVar10 = psVar2->img_buffer;
                  goto LAB_00161428;
                }
                sVar3 = '\0';
              }
              if (sVar3 != "JFIF"[lVar16]) {
                bVar17 = false;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 5);
            iVar15 = uVar7 - 7;
            if (bVar17) {
              z->jfif = 1;
            }
          }
          stbi__skip(z->s,iVar15);
          goto LAB_001617e6;
        }
        goto LAB_001616e8;
      }
      uVar7 = stbi__get16be(z->s);
      iVar15 = uVar7 - 2;
      if (2 < uVar7) {
        do {
          psVar2 = z->s;
          pbVar9 = psVar2->img_buffer;
          if (pbVar9 < psVar2->img_buffer_end) {
LAB_001612ac:
            psVar2->img_buffer = pbVar9 + 1;
            bVar5 = *pbVar9;
            bVar17 = 0xf < bVar5;
            if (((bVar5 & 0xf0) != 0x10 && bVar17) || (uVar7 = bVar5 & 0xf, 3 < uVar7))
            goto LAB_001616e8;
          }
          else {
            if (psVar2->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar2);
              pbVar9 = psVar2->img_buffer;
              goto LAB_001612ac;
            }
            bVar17 = false;
            uVar7 = 0;
          }
          lVar16 = 0;
          do {
            psVar2 = z->s;
            if (bVar17 == false) {
              pbVar9 = psVar2->img_buffer;
              if (psVar2->img_buffer_end <= pbVar9) {
                if (psVar2->read_from_callbacks == 0) {
                  uVar6 = 0;
                  goto LAB_0016133c;
                }
                stbi__refill_buffer(psVar2);
                pbVar9 = psVar2->img_buffer;
              }
              psVar2->img_buffer = pbVar9 + 1;
              uVar6 = (ushort)*pbVar9;
            }
            else {
              iVar8 = stbi__get16be(psVar2);
              uVar6 = (ushort)iVar8;
            }
LAB_0016133c:
            *(ushort *)((long)z->dequant[0] + (ulong)""[lVar16] * 2 + (ulong)(uVar7 << 7)) = uVar6;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          iVar15 = iVar15 + (uint)(bVar17 ^ 1) * 0x40 + -0x81;
        } while (0 < iVar15);
      }
    }
    bVar17 = iVar15 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar15 = stbi__get16be(z->s);
      if (iVar15 == 4) {
        iVar15 = stbi__get16be(z->s);
        z->restart_interval = iVar15;
LAB_001617e6:
        bVar17 = true;
        goto LAB_001617e8;
      }
    }
    else if (m != 0xff) goto LAB_0016139f;
LAB_001616e8:
    *(char **)(in_FS_OFFSET + -0x10) = "Corrupt JPEG";
LAB_001616f8:
    bVar17 = false;
  }
LAB_001617e8:
  return (int)bVar17;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4, sixteen = (p != 0);
            int t = q & 15,i;
            if (p != 0 && p != 1) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");

            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = (stbi__uint16)(sixteen ? stbi__get16be(z->s) : stbi__get8(z->s));
            L -= (sixteen ? 129 : 65);
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }

   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      L = stbi__get16be(z->s);
      if (L < 2) {
         if (m == 0xFE)
            return stbi__err("bad COM len","Corrupt JPEG");
         else
            return stbi__err("bad APP len","Corrupt JPEG");
      }
      L -= 2;

      if (m == 0xE0 && L >= 5) { // JFIF APP0 segment
         static const unsigned char tag[5] = {'J','F','I','F','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 5; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 5;
         if (ok)
            z->jfif = 1;
      } else if (m == 0xEE && L >= 12) { // Adobe APP14 segment
         static const unsigned char tag[6] = {'A','d','o','b','e','\0'};
         int ok = 1;
         int i;
         for (i=0; i < 6; ++i)
            if (stbi__get8(z->s) != tag[i])
               ok = 0;
         L -= 6;
         if (ok) {
            stbi__get8(z->s); // version
            stbi__get16be(z->s); // flags0
            stbi__get16be(z->s); // flags1
            z->app14_color_transform = stbi__get8(z->s); // color transform
            L -= 6;
         }
      }

      stbi__skip(z->s, L);
      return 1;
   }

   return stbi__err("unknown marker","Corrupt JPEG");
}